

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O0

void drawAntiRound(ostream *out,double x,double y,double width,double height)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double Ry;
  double Rx;
  double d;
  double m;
  double y2;
  double x2;
  double *w;
  double *h;
  double height_local;
  double width_local;
  double y_local;
  double x_local;
  ostream *out_local;
  
  dVar2 = x + width;
  dVar3 = height / 2.0;
  dVar4 = width / 2.0;
  dVar5 = height / 2.0;
  std::operator<<(out,"\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"");
  poVar1 = std::operator<<(out," M ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + dVar3);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + dVar3);
  poVar1 = std::operator<<(out," A ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar4);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar5);
  poVar1 = std::operator<<(poVar1," 0 0 1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x + dVar4);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2 - dVar4);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + height);
  poVar1 = std::operator<<(out," A ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar4);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar5);
  poVar1 = std::operator<<(poVar1," 0 0 1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + dVar3);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + dVar3);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + dVar3);
  poVar1 = std::operator<<(out," A ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar4);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar5);
  poVar1 = std::operator<<(poVar1," 0 0 1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2 - dVar4);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2 - dVar4);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y);
  poVar1 = std::operator<<(out," L ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x + dVar4);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y);
  poVar1 = std::operator<<(out," A ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar4);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar5);
  poVar1 = std::operator<<(poVar1," 0 0 1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,y + dVar3);
  std::operator<<(out," z\"");
  std::operator<<(out,"/>\n");
  return;
}

Assistant:

void drawAntiRound(ostream& out, double x, double y, double width, double height) {
	double& h = height;
	double& w = width;
	double x2 = x+w;
	double y2 = y+h;
	double m  = h/2.0;
	double d  = w/2.0;
	double Rx  = d;
	double Ry  = h/2;

	out << "\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"";
	out << " M " << x          << " " << y+m;
	out << " L " << x           << " " << y+m;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x+d << " " << y2;
	out << " L " << x2-d        << " " << y2;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x2 << " " << y+m;
	out << " L " << x2          << " " << y+m;
	out << " L " << x2          << " " << y+m;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x2-d << " " << y;
	out << " L " << x2-d        << " " << y;
	out << " L " << x+d         << " " << y;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x << " " << y+m;
	out << " z\"";
	out << "/>\n";
}